

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int ws_get_header(nni_ws *ws,char *nm,void *buf,size_t *szp,nni_type t)

{
  char *str;
  char *s;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  char *nm_local;
  nni_ws *ws_local;
  
  str = nni_http_get_header(ws->http,nm + 10);
  if (str == (char *)0x0) {
    ws_local._4_4_ = 0xc;
  }
  else {
    ws_local._4_4_ = nni_copyout_str(str,buf,szp,t);
  }
  return ws_local._4_4_;
}

Assistant:

static int
ws_get_header(nni_ws *ws, const char *nm, void *buf, size_t *szp, nni_type t)
{
	const char *s;
	nm += strlen(NNG_OPT_WS_HEADER);
	s = nni_http_get_header(ws->http, nm);
	if (s == NULL) {
		return (NNG_ENOENT);
	}
	return (nni_copyout_str(s, buf, szp, t));
}